

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

Color gui::Style::blendColors(Color *src,Color *dest)

{
  byte *in_RSI;
  byte *in_RDI;
  Color local_4;
  
  sf::Color::Color(&local_4,(Uint8)((long)(int)((uint)*in_RDI * (uint)in_RDI[3] +
                                               (uint)*in_RSI * (0xff - (uint)in_RDI[3])) / 0xff),
                   (Uint8)((int)((uint)in_RDI[1] * (uint)in_RDI[3] +
                                (uint)in_RSI[1] * (0xff - (uint)in_RDI[3])) / 0xff),
                   (Uint8)((long)(int)((uint)in_RDI[2] * (uint)in_RDI[3] +
                                      (uint)in_RSI[2] * (0xff - (uint)in_RDI[3])) / 0xff),in_RSI[3])
  ;
  return local_4;
}

Assistant:

sf::Color Style::blendColors(const sf::Color& src, const sf::Color& dest) {
    return {
        static_cast<uint8_t>((static_cast<int>(src.r) * src.a + static_cast<int>(dest.r) * (255 - src.a)) / 255),
        static_cast<uint8_t>((static_cast<int>(src.g) * src.a + static_cast<int>(dest.g) * (255 - src.a)) / 255),
        static_cast<uint8_t>((static_cast<int>(src.b) * src.a + static_cast<int>(dest.b) * (255 - src.a)) / 255),
        dest.a
    };
}